

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void run_xor_test(void)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  bitset_container_t *bitset;
  run_container_t *run;
  run_container_t *run_00;
  run_container_t *run_01;
  run_container_t *run_02;
  array_container_t *paVar6;
  int iVar7;
  int i;
  int x_4;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  int x;
  uint uVar12;
  ulong uVar13;
  array_container_t *paVar14;
  unsigned_long a;
  unsigned_long uVar15;
  ulong unaff_R15;
  ulong uVar16;
  container_t *C;
  array_container_t *local_38;
  
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  bitset = bitset_container_create();
  run = run_container_create();
  run_00 = run_container_create();
  run_01 = run_container_create();
  uVar13 = 0;
  run_02 = run_container_create();
  do {
    if ((uint)((int)uVar13 + (int)(uVar13 / 5) * -5) < 3) {
      iVar8 = container->cardinality;
      uVar11 = (ushort)uVar13;
      if (((long)iVar8 == 0) ||
         ((iVar8 != 0x7fffffff && (container->array[(long)iVar8 + -1] < uVar11)))) {
        if (iVar8 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        iVar8 = container->cardinality;
        container->cardinality = iVar8 + 1;
        container->array[iVar8] = uVar11;
      }
      else {
        iVar5 = iVar8 + -1;
        uVar12 = 0;
        uVar16 = unaff_R15;
        do {
          if (iVar5 < (int)uVar12) {
            unaff_R15 = (ulong)~uVar12;
            break;
          }
          uVar9 = uVar12 + iVar5 >> 1;
          unaff_R15 = (ulong)uVar9;
          uVar1 = *(ushort *)((long)container->array + (ulong)(uVar12 + iVar5 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar9 + 1;
            bVar3 = true;
            unaff_R15 = uVar16;
          }
          else if (uVar11 < uVar1) {
            iVar5 = uVar9 - 1;
            bVar3 = true;
            unaff_R15 = uVar16;
          }
          else {
            bVar3 = false;
          }
          uVar16 = unaff_R15;
        } while (bVar3);
        if ((iVar8 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
          if (iVar8 == container->capacity) {
            array_container_grow(container,container->capacity + 1,true);
          }
          uVar12 = ~(uint)unaff_R15;
          unaff_R15 = (ulong)uVar12;
          memmove(container->array + unaff_R15 + 1,container->array + unaff_R15,
                  (long)(int)(iVar8 - uVar12) * 2);
          container->array[unaff_R15] = uVar11;
          container->cardinality = container->cardinality + 1;
        }
      }
      uVar16 = src_2->words[uVar13 >> 6];
      uVar10 = uVar16 | 1L << (uVar13 & 0x3f);
      src_2->cardinality = src_2->cardinality + (int)((uVar16 ^ uVar10) >> ((byte)uVar13 & 0x3f));
      src_2->words[uVar13 >> 6] = uVar10;
      run_container_add(run,uVar11);
    }
    uVar12 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar12;
  } while (uVar12 != 0x10000);
  uVar13 = 0;
  do {
    if ((uint)((int)((uVar13 >> 1) / 0x1f) * -0x3f + (int)((uVar13 >> 1) / 0x1f) + (int)uVar13) <
        0x25) {
      iVar8 = container_00->cardinality;
      uVar11 = (ushort)uVar13;
      if (((long)iVar8 == 0) ||
         ((iVar8 != 0x7fffffff && (container_00->array[(long)iVar8 + -1] < uVar11)))) {
        if (iVar8 == container_00->capacity) {
          array_container_grow(container_00,container_00->capacity + 1,true);
        }
        iVar8 = container_00->cardinality;
        container_00->cardinality = iVar8 + 1;
        container_00->array[iVar8] = uVar11;
      }
      else {
        iVar5 = iVar8 + -1;
        uVar12 = 0;
        uVar16 = unaff_R15;
        do {
          if (iVar5 < (int)uVar12) {
            unaff_R15 = (ulong)~uVar12;
            break;
          }
          uVar9 = uVar12 + iVar5 >> 1;
          unaff_R15 = (ulong)uVar9;
          uVar1 = *(ushort *)((long)container_00->array + (ulong)(uVar12 + iVar5 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar9 + 1;
            bVar3 = true;
            unaff_R15 = uVar16;
          }
          else if (uVar11 < uVar1) {
            iVar5 = uVar9 - 1;
            bVar3 = true;
            unaff_R15 = uVar16;
          }
          else {
            bVar3 = false;
          }
          uVar16 = unaff_R15;
        } while (bVar3);
        if ((iVar8 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
          if (iVar8 == container_00->capacity) {
            array_container_grow(container_00,container_00->capacity + 1,true);
          }
          uVar12 = ~(uint)unaff_R15;
          unaff_R15 = (ulong)uVar12;
          memmove(container_00->array + unaff_R15 + 1,container_00->array + unaff_R15,
                  (long)(int)(iVar8 - uVar12) * 2);
          container_00->array[unaff_R15] = uVar11;
          container_00->cardinality = container_00->cardinality + 1;
        }
      }
      uVar16 = src_2_00->words[uVar13 >> 6];
      uVar10 = uVar16 | 1L << (uVar13 & 0x3f);
      src_2_00->cardinality =
           src_2_00->cardinality + (int)((uVar16 ^ uVar10) >> ((byte)uVar13 & 0x3f));
      src_2_00->words[uVar13 >> 6] = uVar10;
      run_container_add(run_00,uVar11);
    }
    uVar12 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar12;
  } while (uVar12 != 0x10000);
  uVar13 = 0;
  do {
    iVar8 = (int)uVar13;
    if ((uint)((int)((uVar13 >> 1) / 0x1f) * -0x3f + (int)((uVar13 >> 1) / 0x1f) + iVar8) < 0x25 !=
        (uint)(iVar8 + (int)(uVar13 / 5) * -5) < 3) {
      iVar5 = container_02->cardinality;
      uVar11 = (ushort)uVar13;
      if (((long)iVar5 == 0) ||
         ((iVar5 != 0x7fffffff && (container_02->array[(long)iVar5 + -1] < uVar11)))) {
        if (iVar5 == container_02->capacity) {
          array_container_grow(container_02,container_02->capacity + 1,true);
        }
        iVar5 = container_02->cardinality;
        container_02->cardinality = iVar5 + 1;
        container_02->array[iVar5] = uVar11;
      }
      else {
        iVar7 = iVar5 + -1;
        uVar12 = 0;
        paVar6 = container_02;
        do {
          if (iVar7 < (int)uVar12) {
            uVar9 = ~uVar12;
            break;
          }
          uVar9 = uVar12 + iVar7 >> 1;
          paVar14 = (array_container_t *)(ulong)uVar9;
          uVar1 = *(ushort *)((long)container_02->array + (ulong)(uVar12 + iVar7 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar9 + 1;
            bVar3 = true;
            paVar14 = paVar6;
          }
          else if (uVar11 < uVar1) {
            iVar7 = uVar9 - 1;
            bVar3 = true;
            paVar14 = paVar6;
          }
          else {
            bVar3 = false;
          }
          uVar9 = (uint)paVar14;
          paVar6 = paVar14;
        } while (bVar3);
        if ((iVar5 != 0x7fffffff) && ((int)uVar9 < 0)) {
          if (iVar5 == container_02->capacity) {
            array_container_grow(container_02,container_02->capacity + 1,true);
          }
          uVar9 = ~uVar9;
          memmove(container_02->array + (ulong)uVar9 + 1,container_02->array + uVar9,
                  (long)(int)(iVar5 - uVar9) * 2);
          container_02->array[uVar9] = uVar11;
          container_02->cardinality = container_02->cardinality + 1;
        }
      }
      uVar16 = bitset->words[uVar13 >> 6];
      uVar10 = uVar16 | 1L << (uVar13 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar16 ^ uVar10) >> ((byte)uVar13 & 0x3f));
      bitset->words[uVar13 >> 6] = uVar10;
    }
    uVar13 = (ulong)(iVar8 + 1U);
  } while (iVar8 + 1U != 0x10000);
  uVar13 = 0;
  paVar6 = container_02;
  do {
    uVar9 = (uint)uVar13;
    uVar12 = uVar9 + (int)(uVar13 / 5) * -5;
    if ((uVar12 < 2) || (10000 < uVar9 && uVar12 == 2)) {
      iVar8 = container_01->cardinality;
      uVar11 = (ushort)uVar13;
      if (((long)iVar8 == 0) ||
         ((iVar8 != 0x7fffffff && (container_01->array[(long)iVar8 + -1] < uVar11)))) {
        if (iVar8 == container_01->capacity) {
          array_container_grow(container_01,container_01->capacity + 1,true);
        }
        iVar8 = container_01->cardinality;
        container_01->cardinality = iVar8 + 1;
        container_01->array[iVar8] = uVar11;
      }
      else {
        iVar5 = iVar8 + -1;
        uVar12 = 0;
        paVar14 = paVar6;
        do {
          if (iVar5 < (int)uVar12) {
            paVar6 = (array_container_t *)(ulong)~uVar12;
            break;
          }
          uVar2 = uVar12 + iVar5 >> 1;
          paVar6 = (array_container_t *)(ulong)uVar2;
          uVar1 = *(ushort *)((long)container_01->array + (ulong)(uVar12 + iVar5 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar2 + 1;
            bVar3 = true;
            paVar6 = paVar14;
          }
          else if (uVar11 < uVar1) {
            iVar5 = uVar2 - 1;
            bVar3 = true;
            paVar6 = paVar14;
          }
          else {
            bVar3 = false;
          }
          paVar14 = paVar6;
        } while (bVar3);
        if ((iVar8 != 0x7fffffff) && ((int)(uint)paVar6 < 0)) {
          if (iVar8 == container_01->capacity) {
            array_container_grow(container_01,container_01->capacity + 1,true);
          }
          uVar12 = ~(uint)paVar6;
          paVar6 = (array_container_t *)(ulong)uVar12;
          memmove(container_01->array + (long)((long)&paVar6->cardinality + 1),
                  container_01->array + (long)paVar6,(long)(int)(iVar8 - uVar12) * 2);
          container_01->array[(long)paVar6] = uVar11;
          container_01->cardinality = container_01->cardinality + 1;
        }
      }
      uVar16 = src_2_01->words[uVar13 >> 6];
      uVar10 = uVar16 | 1L << (uVar13 & 0x3f);
      src_2_01->cardinality =
           src_2_01->cardinality + (int)((uVar16 ^ uVar10) >> ((byte)uVar13 & 0x3f));
      src_2_01->words[uVar13 >> 6] = uVar10;
      run_container_add(run_01,uVar11);
    }
    uVar13 = (ulong)(uVar9 + 1);
  } while (uVar9 + 1 != 0x10000);
  uVar12 = 1;
  iVar8 = 0;
  do {
    if ((uVar12 & 3) != 0) {
      run_container_add(run_02,(uint16_t)iVar8);
    }
    uVar12 = (uVar12 * 0xd68 + 0x1a85) % 0x26f5;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x10000);
  a = (unsigned_long)container_02->cardinality;
  local_38 = (array_container_t *)0x0;
  _Var4 = run_bitset_container_xor(run,src_2,&local_38);
  _assert_true((ulong)!_Var4,"run_bitset_container_xor(R1, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x23d);
  _assert_int_equal(0,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x23e);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar8 = array_run_container_xor(container,run,&local_38);
  _assert_int_equal(2,(long)iVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x242);
  _assert_int_equal(0,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x243);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar8 = run_run_container_xor(run,run,&local_38);
  _assert_int_equal(3,(long)iVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x249);
  iVar8 = run_container_cardinality((run_container_t *)local_38);
  _assert_int_equal(0,(long)iVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x24a);
  run_container_free((run_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  _Var4 = run_bitset_container_xor(run,src_2_01,&local_38);
  _assert_true((ulong)!_Var4,"run_bitset_container_xor(R1, B3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x24e);
  _assert_int_equal(2000,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x24f);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar8 = array_run_container_xor(container_01,run,&local_38);
  _assert_int_equal(2,(long)iVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x253);
  _assert_int_equal(2000,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x254);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar8 = run_run_container_xor(run,run_01,&local_38);
  _assert_int_equal(2,(long)iVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,600);
  _assert_int_equal(2000,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x259);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  _Var4 = run_bitset_container_xor(run,src_2_00,&local_38);
  _assert_true((ulong)_Var4,"run_bitset_container_xor(R1, B2, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x25d);
  _assert_int_equal(a,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x25e);
  bitset_container_free((bitset_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  iVar8 = array_run_container_xor(container_00,run,&local_38);
  _assert_int_equal(1,(long)iVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x263);
  _assert_int_equal(a,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x264);
  bitset_container_free((bitset_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  iVar8 = 1000;
  paVar6 = array_container_create();
  uVar15 = a;
  do {
    iVar5 = paVar6->cardinality;
    uVar11 = (ushort)iVar8;
    if (((long)iVar5 == 0) || ((iVar5 != 0x7fffffff && (paVar6->array[(long)iVar5 + -1] < uVar11))))
    {
      if (iVar5 == paVar6->capacity) {
        array_container_grow(paVar6,paVar6->capacity + 1,true);
      }
      iVar5 = paVar6->cardinality;
      paVar6->cardinality = iVar5 + 1;
      paVar6->array[iVar5] = uVar11;
    }
    else {
      iVar7 = iVar5 + -1;
      uVar12 = 0;
      do {
        if (iVar7 < (int)uVar12) {
          uVar15 = (unsigned_long)~uVar12;
          break;
        }
        uVar9 = uVar12 + iVar7 >> 1;
        uVar1 = *(ushort *)((long)paVar6->array + (ulong)(uVar12 + iVar7 & 0xfffffffe));
        if (uVar1 < uVar11) {
          uVar12 = uVar9 + 1;
          bVar3 = true;
        }
        else if (uVar11 < uVar1) {
          iVar7 = uVar9 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          uVar15 = (unsigned_long)uVar9;
        }
      } while (bVar3);
      if ((iVar5 != 0x7fffffff) && ((int)(uint)uVar15 < 0)) {
        if (iVar5 == paVar6->capacity) {
          array_container_grow(paVar6,paVar6->capacity + 1,true);
        }
        uVar12 = ~(uint)uVar15;
        uVar15 = (unsigned_long)uVar12;
        memmove(paVar6->array + uVar15 + 1,paVar6->array + uVar15,(long)(int)(iVar5 - uVar12) * 2);
        paVar6->array[uVar15] = uVar11;
        paVar6->cardinality = paVar6->cardinality + 1;
      }
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 0x3f2) {
      iVar8 = array_run_container_xor(paVar6,run_00,&local_38);
      _assert_int_equal(3,(long)iVar8,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x26c);
      iVar8 = run_container_cardinality((run_container_t *)local_38);
      _assert_int_equal(0x98bd,(long)iVar8,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x26d);
      run_container_free((run_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      iVar8 = run_run_container_xor(run,run_00,&local_38);
      _assert_int_equal(1,(long)iVar8,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x271);
      _assert_int_equal(a,(long)local_38->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x272);
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      _Var4 = run_bitset_container_xor(run_02,src_2_01,&local_38);
      _assert_true((ulong)_Var4,"run_bitset_container_xor(R4, B3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x276);
      iVar8 = local_38->cardinality;
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      iVar5 = array_run_container_xor(container_01,run_02,&local_38);
      _assert_int_equal(1,(long)iVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x27d);
      _assert_int_equal((long)iVar8,(long)local_38->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x27f);
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      iVar5 = run_run_container_xor(run_02,run_01,&local_38);
      _assert_int_equal(1,(long)iVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x283);
      _assert_int_equal((long)iVar8,(long)local_38->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x284);
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      array_container_free(container_02);
      array_container_free(paVar6);
      bitset_container_free(src_2);
      bitset_container_free(src_2_00);
      bitset_container_free(src_2_01);
      bitset_container_free(bitset);
      run_container_free(run);
      run_container_free(run_00);
      run_container_free(run_01);
      run_container_free(run_02);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(run_xor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    assert_false(run_bitset_container_xor(R1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A1, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE, run_run_container_xor(R1, R1, &C));
    assert_int_equal(0, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_false(run_bitset_container_xor(R1, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A3, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, run_run_container_xor(R1, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R1, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A2, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_t* A_small = array_container_create();
    for (int i = 1000; i < 1010; ++i) array_container_add(A_small, i);

    assert_int_equal(RUN_CONTAINER_TYPE,
                     array_run_container_xor(A_small, R2, &C));
    assert_int_equal(0x98bd, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R1, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R4, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A3, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R4, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}